

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CQuad,_allocator_default<CQuad>_>::clear(array<CQuad,_allocator_default<CQuad>_> *this)

{
  CQuad *pCVar1;
  
  allocator_default<CQuad>::free_array(this->list);
  this->list_size = 1;
  pCVar1 = (CQuad *)operator_new__(0x98);
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}